

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall BpTree<int>::Delete_Aux(BpTree<int> *this,IndexNode<int> *C,int k,Addr p)

{
  Addr *pAVar1;
  vector<char,_std::allocator<char>_> *__x;
  vector<Addr,_std::allocator<Addr>_> *__x_00;
  pointer piVar2;
  pointer pAVar3;
  Addr *pAVar4;
  bool bVar5;
  BpTree<int> *this_00;
  char cVar6;
  uint uVar7;
  pointer pcVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint j;
  long lVar13;
  uint uVar14;
  vector<int,_std::allocator<int>_> *__x_01;
  ulong uVar15;
  int iVar16;
  size_t sVar17;
  ulong uVar18;
  IndexNode<int> *C_00;
  bool bVar19;
  bool bVar20;
  IndexNode<int> D;
  IndexNode<int> P;
  IndexNode<int> *local_790;
  IndexNode<int> local_758;
  BpTree<int> *local_6f8;
  IndexNode<int> local_6f0;
  IndexNode<int> local_690;
  IndexNode<int> local_630;
  IndexNode<int> local_5d0;
  IndexNode<int> local_570;
  IndexNode<int> local_510;
  IndexNode<int> local_4b0;
  IndexNode<int> local_450;
  char local_3f0;
  vector<int,_std::allocator<int>_> local_3e8;
  vector<char,_std::allocator<char>_> local_3d0;
  vector<Addr,_std::allocator<Addr>_> local_3b8;
  Addr local_3a0;
  Addr AStack_398;
  IndexNode<int> local_390;
  IndexNode<int> local_330;
  IndexNode<int> local_2d0;
  IndexNode<int> local_270;
  char local_210;
  vector<int,_std::allocator<int>_> local_208;
  vector<char,_std::allocator<char>_> local_1f0;
  vector<Addr,_std::allocator<Addr>_> local_1d8;
  Addr local_1c0;
  Addr AStack_1b8;
  char local_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  vector<char,_std::allocator<char>_> local_190;
  vector<Addr,_std::allocator<Addr>_> local_178;
  Addr local_160;
  Addr AStack_158;
  char local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<char,_std::allocator<char>_> local_130;
  vector<Addr,_std::allocator<Addr>_> local_118;
  Addr local_100;
  Addr AStack_f8;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  local_3f0 = C->NodeState;
  __x_01 = &C->k;
  local_6f8 = this;
  std::vector<int,_std::allocator<int>_>::vector(&local_3e8,__x_01);
  __x = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_3d0,__x);
  __x_00 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_3b8,__x_00);
  local_3a0 = C->parent;
  AStack_398 = C->self;
  Buffer::Lock(&blocks,AStack_398.BlockNum);
  if (local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this_00 = local_6f8;
  IndexNode<int>::IndexNode(&local_758,local_6f8->N);
  iVar16 = this_00->N;
  uVar11 = iVar16 - 1;
  uVar15 = 0;
  if (1 < iVar16) {
    uVar15 = 0;
    do {
      if ((__x_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar15] == k) goto LAB_00135aed;
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
    uVar15 = (ulong)uVar11;
  }
LAB_00135aed:
  iVar9 = (int)uVar15 + 1;
  if (iVar9 < (int)uVar11) {
    uVar15 = uVar15 & 0xffffffff;
    do {
      piVar2 = (__x_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2[uVar15 & 0xffffffff] = piVar2[uVar15 + 1];
      pcVar8 = (__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar8[uVar15 & 0xffffffff] = pcVar8[uVar15 + 1];
      iVar16 = this_00->N;
      uVar15 = uVar15 + 1;
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar16 + -1);
  }
  (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [(long)iVar16 + -2] = '0';
  local_150 = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_148,__x_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_130,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_118,__x_00);
  cVar6 = local_150;
  pAVar1 = &C->parent;
  local_100 = *pAVar1;
  AStack_f8 = C->self;
  if (local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar11 = this_00->N;
  if (cVar6 == '1') {
    uVar14 = uVar11 - 1;
    uVar15 = 0;
    if (1 < (int)uVar11) {
      uVar15 = 0;
      do {
        if ((__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar15].FileOff == p.FileOff) goto LAB_00135c0b;
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
      uVar15 = (ulong)uVar14;
    }
LAB_00135c0b:
    iVar16 = (int)uVar15 + 1;
    lVar12 = -0xc;
    lVar13 = -0x10;
    if (iVar16 < (int)uVar14) {
      uVar15 = uVar15 & 0xffffffff;
      do {
        pAVar3 = (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar3[uVar15 & 0xffffffff] = pAVar3[uVar15 + 1];
        uVar11 = this_00->N;
        uVar15 = uVar15 + 1;
        iVar16 = iVar16 + 1;
      } while (iVar16 < (int)(uVar11 - 1));
    }
  }
  else {
    if ((int)uVar11 < 1) {
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      do {
        if ((__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar15].FileOff == p.FileOff) goto LAB_00135c67;
        uVar15 = uVar15 + 1;
      } while (uVar11 != uVar15);
      uVar15 = (ulong)uVar11;
    }
LAB_00135c67:
    iVar16 = (int)uVar15 + 1;
    lVar12 = -4;
    lVar13 = -8;
    if (iVar16 < (int)uVar11) {
      uVar15 = uVar15 & 0xffffffff;
      do {
        pAVar3 = (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar3[uVar15 & 0xffffffff] = pAVar3[uVar15 + 1];
        uVar11 = this_00->N;
        uVar15 = uVar15 + 1;
        iVar16 = iVar16 + 1;
      } while (iVar16 < (int)uVar11);
    }
  }
  pAVar3 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *(undefined4 *)((long)&pAVar3[(int)uVar11].BlockNum + lVar13) = 0xffffffff;
  *(undefined4 *)((long)&pAVar3[(int)uVar11].BlockNum + lVar12) = 0xffffffff;
  local_1b0 = C->NodeState;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a8,__x_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_190,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_178,__x_00);
  local_160 = *pAVar1;
  AStack_158 = C->self;
  iVar16 = local_160.FileOff;
  if (local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar16 == -1) {
    local_210 = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_208,__x_01);
    std::vector<char,_std::allocator<char>_>::vector(&local_1f0,__x);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1d8,__x_00);
    cVar6 = local_210;
    local_1c0 = *pAVar1;
    AStack_1b8 = C->self;
    if (local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (cVar6 == '1') {
      if (*(__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start == '0') {
LAB_001368fe:
        this_00->RootAddr =
             *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
              ._M_start;
        DeleteNode(this_00,C);
        goto LAB_00136b50;
      }
      local_270.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_270.k,__x_01);
      std::vector<char,_std::allocator<char>_>::vector(&local_270.v,__x);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_270.p,__x_00);
      local_270.parent = *pAVar1;
      local_270.self = C->self;
      UpdateBlock(this_00,&local_270);
      if (local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      if (local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_270.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
    else {
      pAVar4 = (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pAVar4[1].FileOff == -1) {
        FindNode(this_00,*pAVar4,&local_758);
        local_758.parent = *pAVar1;
        local_5d0.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_5d0.k,&local_758.k);
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar15 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar15 == 0) {
          pcVar8 = (pointer)0x0;
          sVar17 = 0;
        }
        else {
          if ((long)uVar15 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar8 = (pointer)operator_new(uVar15);
          sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar8 + uVar15;
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar8;
        if (local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
          memmove(pcVar8,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar17);
        }
        local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar8 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_5d0.p,&local_758.p);
        local_5d0.parent = local_758.parent;
        local_5d0.self = local_758.self;
        UpdateBlock(this_00,&local_5d0);
        if (local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        goto LAB_001368fe;
      }
      local_2d0.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_2d0.k,__x_01);
      std::vector<char,_std::allocator<char>_>::vector(&local_2d0.v,__x);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2d0.p,__x_00);
      local_2d0.parent = *pAVar1;
      local_2d0.self = C->self;
      UpdateBlock(this_00,&local_2d0);
      if (local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    local_330.NodeState = C->NodeState;
    std::vector<int,_std::allocator<int>_>::vector(&local_330.k,__x_01);
    std::vector<char,_std::allocator<char>_>::vector(&local_330.v,__x);
    std::vector<Addr,_std::allocator<Addr>_>::vector(&local_330.p,__x_00);
    local_330.parent = *pAVar1;
    local_330.self = C->self;
    iVar16 = IsFew(this_00,&local_330);
    if (local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (iVar16 == 0) {
      local_390.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_390.k,__x_01);
      std::vector<char,_std::allocator<char>_>::vector(&local_390.v,__x);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_390.p,__x_00);
      local_390.parent = *pAVar1;
      local_390.self = C->self;
      UpdateBlock(this_00,&local_390);
      if (local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_390.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      if (local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_390.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_390.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
      goto joined_r0x00136289;
    }
    IndexNode<int>::IndexNode(&local_450,this_00->N);
    FindNode(this_00,*pAVar1,&local_450);
    uVar11 = this_00->N;
    bVar19 = false;
    uVar15 = 0;
    if (0 < (int)uVar11) {
      uVar15 = 0;
      do {
        if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15].FileOff == (C->self).FileOff)
        goto LAB_00135e67;
        uVar15 = uVar15 + 1;
      } while (uVar11 != uVar15);
      uVar15 = (ulong)uVar11;
    }
LAB_00135e67:
    iVar16 = (int)uVar15;
    uVar14 = iVar16 + 1;
    if ((int)uVar14 < (int)uVar11) {
      uVar11 = 0xffffffff;
      if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14].FileOff == -1) goto LAB_00136333;
      FindNode(this_00,local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14],&local_758);
      if (iVar16 != 0) {
LAB_00135ebb:
        if ((this_00->N <= (int)uVar14) ||
           (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14].FileOff == -1)) {
          bVar19 = false;
          if (iVar16 != 0) goto LAB_0013632e;
          goto LAB_001369a3;
        }
        IndexNode<int>::IndexNode(&local_90,C);
        IndexNode<int>::IndexNode(&local_f0,&local_758);
        iVar9 = CanFit(this_00,&local_90,&local_f0);
        bVar19 = iVar9 != 0;
        if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (iVar16 == 0) goto LAB_001369a3;
LAB_00136baa:
        uVar11 = 0xffffffff;
        if (bVar19) {
          uVar11 = uVar14;
        }
        goto LAB_00136333;
      }
      local_4b0.NodeState = C->NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_4b0.k,__x_01);
      std::vector<char,_std::allocator<char>_>::vector(&local_4b0.v,__x);
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_4b0.p,__x_00);
      local_4b0.parent = *pAVar1;
      local_4b0.self = C->self;
      local_630.NodeState = local_758.NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_630.k,&local_758.k);
      local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar18 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar18 == 0) {
        pcVar8 = (pointer)0x0;
        sVar17 = 0;
      }
      else {
        if ((long)uVar18 < 0) {
          std::__throw_bad_alloc();
        }
        pcVar8 = (pointer)operator_new(uVar18);
        sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar8 + uVar18;
      local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = pcVar8;
      if (local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar8;
        memmove(pcVar8,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar17);
      }
      local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar8 + sVar17;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_630.p,&local_758.p);
      local_630.parent = local_758.parent;
      local_630.self = local_758.self;
      iVar9 = CanFit(this_00,&local_4b0,&local_630);
      bVar19 = true;
      if (iVar9 == 0) goto LAB_00135ebb;
LAB_001369a3:
      if (local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_630.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_630.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_630.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) goto LAB_00136baa;
      operator_delete(local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4b0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      uVar11 = bVar19 - 1 | 1;
LAB_00136a60:
      uVar10 = 0xffffffff;
      j = 1;
    }
    else {
LAB_0013632e:
      bVar19 = false;
      uVar11 = 0xffffffff;
LAB_00136333:
      if (iVar16 == 0) goto LAB_00136a60;
      uVar10 = iVar16 - 1;
      FindNode(this_00,local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10],&local_758);
      if ((uVar14 == this_00->N) ||
         (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14].FileOff == -1)) {
        local_510.NodeState = C->NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_510.k,__x_01);
        std::vector<char,_std::allocator<char>_>::vector(&local_510.v,__x);
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_510.p,__x_00);
        local_510.parent = *pAVar1;
        local_510.self = C->self;
        local_690.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_690.k,&local_758.k);
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar18 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar18 == 0) {
          pcVar8 = (pointer)0x0;
          sVar17 = 0;
        }
        else {
          if ((long)uVar18 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar8 = (pointer)operator_new(uVar18);
          sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar8 + uVar18;
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar8;
        if (local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
          memmove(pcVar8,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar17);
        }
        local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar8 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_690.p,&local_758.p);
        local_690.parent = local_758.parent;
        local_690.self = local_758.self;
        iVar9 = CanFit(this_00,&local_510,&local_690);
        bVar5 = true;
        bVar20 = true;
        if (iVar9 == 0) goto LAB_001364cf;
LAB_001366ae:
        if (local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_690.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_690.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_690.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_510.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_510.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_510.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar5 = false;
LAB_001364cf:
        local_570.NodeState = C->NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_570.k,__x_01);
        std::vector<char,_std::allocator<char>_>::vector(&local_570.v,__x);
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_570.p,__x_00);
        local_570.parent = *pAVar1;
        local_570.self = C->self;
        local_6f0.NodeState = local_758.NodeState;
        std::vector<int,_std::allocator<int>_>::vector(&local_6f0.k,&local_758.k);
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar18 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar18 == 0) {
          pcVar8 = (pointer)0x0;
          sVar17 = 0;
        }
        else {
          if ((long)uVar18 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar8 = (pointer)operator_new(uVar18);
          sVar17 = (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar8 + uVar18;
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar8;
        if (local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
          memmove(pcVar8,local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar17);
        }
        local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar8 + sVar17;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_6f0.p,&local_758.p);
        local_6f0.parent = local_758.parent;
        local_6f0.self = local_758.self;
        iVar9 = CanFit(this_00,&local_570,&local_6f0);
        bVar20 = iVar9 != 0;
        if (local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_570.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_570.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_570.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (bVar5) goto LAB_001366ae;
      }
      j = uVar10;
      if (bVar20) {
        bVar19 = true;
        uVar11 = uVar10;
      }
    }
    uVar7 = uVar11;
    if (!bVar19) {
      uVar7 = j;
    }
    FindNode(this_00,local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar7],&local_758);
    uVar15 = uVar15 & 0xffffffff;
    if ((int)uVar7 <= iVar16) {
      uVar15 = (long)(int)uVar7;
    }
    if (bVar19) {
      C_00 = &local_758;
      local_790 = C;
      if (uVar11 != uVar14) {
        if (uVar11 != uVar10) goto LAB_00136af9;
        local_790 = &local_758;
        C_00 = C;
      }
      Coalesce(this_00,C_00,local_790,
               local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15]);
    }
    else {
      Redistribute(this_00,C,&local_758,
                   local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15],iVar16,j);
    }
LAB_00136af9:
    if (local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if (local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_450.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
    }
  }
joined_r0x00136289:
  if (local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00136b50:
  if (local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_758.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_758.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_758.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::Delete_Aux(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	IndexNode<K> D(N);
	int pos, i, j, m, n, flag = 0;
	for (i = 0; i < N - 1 && C.k[i] != k; i++);
	for (j = i + 1; j < N - 1; j++) {
		C.k[j - 1] = C.k[j];
		C.v[j - 1] = C.v[j];
	}
	C.v[N - 2] = '0';										//ɾ��k
	if (this->IsLeaf(C)) {
		for (i = 0; i < N - 1 && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N - 1; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 2] = { -1, -1 };
	}
	else {
		for (i = 0; i < N && C.p[i].FileOff != p.FileOff; i++);
		for (j = i + 1; j < N; j++) {
			C.p[j - 1] = C.p[j];
		}
		C.p[N - 1] = { -1, -1 };
	}														//ɾ��p
	if (this->IsRoot(C)) {
		if (this->IsLeaf(C)) {								//������ֻʣһ�����
			if (C.v[0] == '0') {							//��û�м�ֵ
				this->RootAddr = C.p[0];					//�����
				this->DeleteNode(C);
			}
			else {
				//���м�ֵ������
				this->UpdateBlock(C);
			}
		}
		else {												//�����к���
			if (C.p[1].FileOff == -1) {						//��ֻ��һ������
				this->FindNode(C.p[0], D);
				D.parent = C.parent;
				this->UpdateBlock(D);
				this->RootAddr = C.p[0];
				this->DeleteNode(C);						//��ת�������ĺ���
			}
			else {
				//������и��ຢ�ӣ�����
				this->UpdateBlock(C);
			}
		}
		return;
	}
	//�Ǹ����
	if (!this->IsFew(C)) {
		this->UpdateBlock(C);
		return;
	}
	//ָ�������ֵ��̫�٣����Ǻϲ����߷�̯
	j = -1;
	IndexNode<K> P(N);
	this->FindNode(C.parent, P);
	for (i = 0; i < N && P.p[i].FileOff != C.self.FileOff; i++);	//P.p[i] == C.self
	if (i+1 < N && P.p[i + 1].FileOff != -1) {
		this->FindNode(P.p[i + 1], D);
		if ((i == 0 && CanFit(C, D) ||
			(i + 1 < N && P.p[i + 1].FileOff != -1 && CanFit(C, D)))) {
			j = i + 1;		//��������֮�ɺϲ�����D = P_i+1
			flag = 1;
		}
	}
	if (i > 0) {
		this->FindNode(P.p[i - 1], D);
		if (((i + 1 == N || P.p[i + 1].FileOff == -1) && CanFit(C, D)) ||
			(i > 0 && CanFit(C, D))) {
			j = i - 1;		//��������֮�ɺϲ�����D = P_i-1
			flag = 1;
		}
	}
	//�������ڽԿɺϲ�ʱ������ѡD = P_i-1
	if (!flag) {
		j = (i == 0) ? 1 : i - 1;
		//���Ҳ����ɺϲ����ھӣ�����ѡ���ھ�
	}
	this->FindNode(P.p[j], D);
	K k2 = (i < j) ? P.k[i] : P.k[j];
	if (flag) {
		//�ϲ�����
		if (j == i + 1) {
			this->Coalesce(D, C, k2);
		}
		else if(j == i-1) {
			this->Coalesce(C, D, k2);
		}
	}
	else {
		//��̯����
		this->Redistribute(C, D, k2, i, j);
	}
	return;
}